

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O1

int pkey_gost_omac_init(EVP_PKEY_CTX *ctx,size_t mac_size)

{
  int iVar1;
  undefined8 *data;
  EVP_PKEY *pkey;
  undefined4 *puVar2;
  
  data = (undefined8 *)
         CRYPTO_malloc(0x30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                       ,0x255);
  pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx);
  if (data == (undefined8 *)0x0) {
    iVar1 = 0;
  }
  else {
    *data = 0;
    data[1] = 0;
    data[4] = 0;
    data[5] = 0;
    data[2] = 0;
    data[3] = 0;
    *(short *)((long)data + 2) = (short)mac_size;
    *(undefined4 *)((long)data + 4) = 0;
    if (pkey != (EVP_PKEY *)0x0) {
      puVar2 = (undefined4 *)EVP_PKEY_get0(pkey);
      if (puVar2 != (undefined4 *)0x0) {
        *(undefined4 *)((long)data + 4) = *puVar2;
        *(undefined2 *)((long)data + 2) = *(undefined2 *)(puVar2 + 9);
      }
    }
    EVP_PKEY_CTX_set_data((EVP_PKEY_CTX *)ctx,data);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pkey_gost_omac_init(EVP_PKEY_CTX *ctx, size_t mac_size)
{
    struct gost_mac_pmeth_data *data = OPENSSL_malloc(sizeof(*data));
    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);

    if (!data)
        return 0;
    memset(data, 0, sizeof(*data));
    data->mac_size = mac_size;
    data->mac_param_nid = NID_undef;

    if (pkey) {
        struct gost_mac_key *key = EVP_PKEY_get0(pkey);
        if (key) {
            data->mac_param_nid = key->mac_param_nid;
            data->mac_size = key->mac_size;
        }
    }

    EVP_PKEY_CTX_set_data(ctx, data);
    return 1;
}